

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O2

int quote_fname(char *file)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  char ver_buf [16];
  char ver [16];
  char namebuf [256];
  char fbuf [256];
  
  pcVar6 = ver_buf;
  pcVar8 = fbuf;
  pcVar7 = file;
  do {
    cVar1 = *pcVar7;
    if (((cVar1 == '\'') || (cVar1 == ';')) || (cVar1 == '>')) {
      pcVar5 = pcVar8 + 1;
      *pcVar8 = '\'';
      lVar4 = 2;
    }
    else {
      pcVar5 = pcVar8;
      lVar4 = 1;
      if (cVar1 == '\0') break;
    }
    pcVar8 = pcVar8 + lVar4;
    *pcVar5 = cVar1;
    pcVar7 = pcVar7 + 1;
  } while( true );
  *pcVar8 = '\0';
  separate_version(fbuf,ver,1);
  bVar9 = false;
  pcVar8 = fbuf;
  while ((cVar1 = *pcVar8, cVar1 != '\0' && (!bVar9))) {
    pcVar7 = pcVar8 + 1;
    if (cVar1 == '\'') {
      if (pcVar8[1] != '\0') {
        pcVar7 = pcVar8 + 2;
      }
      bVar9 = false;
      pcVar8 = pcVar7;
    }
    else {
      bVar9 = false;
      pcVar8 = pcVar7;
      if (cVar1 == '.') {
        bVar9 = *pcVar7 != '\0';
      }
    }
  }
  if (!bVar9) {
    if (pcVar8[-1] == '.') {
      pcVar8[-1] = '\'';
      pcVar8[0] = '.';
      pcVar8 = pcVar8 + 1;
    }
    pcVar8[0] = '.';
    pcVar8[1] = '\0';
  }
  strcpy(namebuf,fbuf);
  if (ver[0] != '\0') {
    sVar2 = strlen(namebuf);
    (namebuf + sVar2)[0] = '.';
    (namebuf + sVar2)[1] = '~';
    namebuf[sVar2 + 2] = '\0';
    strcat(namebuf,ver);
    sVar2 = strlen(namebuf);
    (namebuf + sVar2)[0] = '~';
    (namebuf + sVar2)[1] = '\0';
  }
  pcVar8 = strchr(namebuf,0x7e);
  if (pcVar8 != (char *)0x0) {
    lVar4 = 1;
    pcVar7 = pcVar8;
    while (pcVar7[lVar4] != '\0') {
      if (pcVar7[lVar4] == '~') {
        pcVar5 = pcVar7 + lVar4;
        lVar4 = 1;
        pcVar8 = pcVar7;
        pcVar7 = pcVar5;
      }
      else {
        lVar4 = lVar4 + 1;
      }
    }
    if ((pcVar8 != pcVar7) && (lVar4 == 1 && pcVar8[-1] == '.')) {
      strncpy(ver_buf,pcVar8 + 1,(size_t)(pcVar7 + ~(ulong)pcVar8));
      ver_buf[(long)(pcVar7 + ~(ulong)pcVar8)] = '\0';
      if (ver_buf[0] != '\0') {
        while (pcVar6 = pcVar6 + 1, ver_buf[0] != '\0') {
          if ((byte)(ver_buf[0] - 0x3aU) < 0xf6) goto LAB_0012f391;
          ver_buf[0] = *pcVar6;
        }
        pcVar8[-1] = ';';
        pcVar8[0] = '\0';
        *pcVar7 = '\0';
        uVar3 = strtoul(pcVar8 + 1,(char **)0x0,10);
        sprintf(ver_buf,"%u",uVar3 & 0xffffffff);
        strcat(namebuf,ver_buf);
      }
    }
  }
LAB_0012f391:
  strcpy(file,namebuf);
  return 1;
}

Assistant:

int quote_fname(char *file)
{
  char *cp, *dp;
  int extensionp;
  char fbuf[MAXNAMLEN + 1], namebuf[MAXNAMLEN + 1], ver[VERSIONLEN];

  cp = file;
  dp = fbuf;

  while (*cp) {
    switch (*cp) {
      case '>':
      case ';':
      case '\'':
        *dp++ = '\'';
        *dp++ = *cp++;
        break;

      default: *dp++ = *cp++; break;
    }
  }
  *dp = '\0';

  /*
   * extensionp indicates whether extension field is included in a file
   * name or not.  If extension field is not included, we have to add a
   * period to specify empty extension field.
   */
  separate_version(fbuf, ver, 1);
  cp = fbuf;
  extensionp = 0;
  while (*cp && !extensionp) {
    switch (*cp) {
      case '.':
        if (*(cp + 1)) extensionp = 1;
        cp++;
        break;

      case '\'':
        if (*(cp + 1) != '\0')
          cp += 2;
        else
          cp++;
        break;

      default: cp++; break;
    }
  }
  if (!extensionp) {
    if (*(cp - 1) == '.') {
      *(cp - 1) = '\'';
      *cp++ = '.';
    }
    *cp++ = '.';
    *cp = '\0';
  }
  if (*ver != '\0') {
    ConcNameAndVersion(fbuf, ver, namebuf);
  } else {
    strcpy(namebuf, fbuf);
  }
  UnixVersionToLispVersion(namebuf, 1);
  strcpy(file, namebuf);
  return (1);
}